

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O0

void __thiscall xe::TestCaseResultData::TestCaseResultData(TestCaseResultData *this,char *casePath)

{
  allocator<char> local_19;
  char *local_18;
  char *casePath_local;
  TestCaseResultData *this_local;
  
  local_18 = casePath;
  casePath_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,casePath,&local_19);
  std::allocator<char>::~allocator(&local_19);
  this->m_statusCode = TESTSTATUSCODE_LAST;
  std::__cxx11::string::string((string *)&this->m_statusDetails);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_data);
  return;
}

Assistant:

TestCaseResultData::TestCaseResultData (const char* casePath)
	: m_casePath	(casePath)
	, m_statusCode	(TESTSTATUSCODE_LAST)
{
}